

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  bool bVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  int local_1cc;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator local_51;
  undefined1 local_50 [8];
  tm time_struct;
  TimeInMillis ms_local;
  
  time_struct.tm_zone = (char *)this;
  bVar1 = PortableLocaltime((long)this / 1000,(tm *)local_50);
  if (bVar1) {
    local_1cc = time_struct.tm_mday + 0x76c;
    StreamableToString<int>(&local_1c8,&local_1cc);
    std::operator+(&local_1a8,&local_1c8,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_1f0,(String *)(ulong)(time_struct.tm_hour + 1),value);
    std::operator+(&local_188,&local_1a8,&local_1f0);
    std::operator+(&local_168,&local_188,"-");
    String::FormatIntWidth2_abi_cxx11_
              (&local_210,(String *)(ulong)(uint)time_struct.tm_min,value_00);
    std::operator+(&local_148,&local_168,&local_210);
    std::operator+(&local_128,&local_148,"T");
    String::FormatIntWidth2_abi_cxx11_
              (&local_230,(String *)(ulong)(uint)time_struct.tm_sec,value_01);
    std::operator+(&local_108,&local_128,&local_230);
    std::operator+(&local_e8,&local_108,":");
    String::FormatIntWidth2_abi_cxx11_(&local_250,(String *)(ulong)(uint)local_50._4_4_,value_02);
    std::operator+(&local_c8,&local_e8,&local_250);
    std::operator+(&local_a8,&local_c8,":");
    String::FormatIntWidth2_abi_cxx11_(&local_270,(String *)(ulong)(uint)local_50._0_4_,value_03);
    std::operator+(&local_88,&local_a8,&local_270);
    std::operator+(__return_storage_ptr__,&local_88,"Z");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,anon_var_dwarf_19ed + 4,&local_51)
    ;
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FormatEpochTimeInMillisAsRFC3339(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec) + "Z";
}